

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O2

NTRUEncodeSchedule * ntru_encode_schedule(uint16_t *ms_in,size_t n)

{
  NTRUEncodeSchedule *sched;
  uint *ptr;
  uint *puVar1;
  size_t i_1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  size_t i;
  size_t sVar5;
  ulong uVar6;
  uint *local_40;
  
  sched = (NTRUEncodeSchedule *)safemalloc(1,0x28,0);
  sched->nvals = n;
  sched->ops = (uint32_t *)0x0;
  sched->endpos = n - 1;
  sched->nops = 0;
  sched->opsize = 0;
  if (n == 0) {
    __assert_fail("n != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ntru.c",
                  0x272,"NTRUEncodeSchedule *ntru_encode_schedule(const uint16_t *, size_t)");
  }
  ptr = (uint *)safemalloc(n,4,0);
  puVar1 = (uint *)safemalloc(n,4,0);
  for (sVar5 = 0; n != sVar5; sVar5 = sVar5 + 1) {
    ptr[sVar5] = (uint)ms_in[sVar5];
  }
  do {
    local_40 = ptr;
    uVar6 = n;
    ptr = puVar1;
    if (uVar6 < 2) {
      if (uVar6 != 1) {
        __assert_fail("n == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ntru.c"
                      ,0x2b4,"NTRUEncodeSchedule *ntru_encode_schedule(const uint16_t *, size_t)");
      }
      for (uVar4 = *local_40; 1 < uVar4; uVar4 = uVar4 + 0xff >> 8) {
        sched_append(sched,1);
      }
      safefree(local_40);
      safefree(ptr);
      return sched;
    }
    n = 0;
    for (uVar2 = 0; puVar1 = local_40, uVar2 < uVar6; uVar2 = uVar2 + 2) {
      if ((uVar2 | 1) == uVar6) {
        sched_append(sched,0);
        ptr[n] = local_40[uVar2];
        n = n + 1;
        break;
      }
      uVar4 = local_40[uVar2];
      uVar3 = local_40[uVar2 | 1];
      sched_append(sched,(short)uVar4 + 2);
      for (uVar3 = uVar3 * uVar4; 0x3fff < uVar3; uVar3 = uVar3 + 0xff >> 8) {
        sched_append(sched,1);
      }
      ptr[n] = uVar3;
      n = n + 1;
    }
  } while( true );
}

Assistant:

NTRUEncodeSchedule *ntru_encode_schedule(const uint16_t *ms_in, size_t n)
{
    NTRUEncodeSchedule *sched = snew(NTRUEncodeSchedule);
    sched->nvals = n;
    sched->endpos = n-1;
    sched->nops = sched->opsize = 0;
    sched->ops = NULL;

    assert(n != 0);

    /*
     * 'ms' is the list of (m_i) on input to the current pass.
     * 'ms_new' is the list output from the current pass. After each
     * pass we swap the arrays round.
     */
    uint32_t *ms = snewn(n, uint32_t);
    uint32_t *msnew = snewn(n, uint32_t);
    for (size_t i = 0; i < n; i++)
        ms[i] = ms_in[i];

    while (n > 1) {
        size_t nnew = 0;
        for (size_t i = 0; i < n; i += 2) {
            if (i+1 == n) {
                /*
                 * Odd element at the end of the input list: just copy
                 * it unchanged to the output.
                 */
                sched_append(sched, ENC_COPY);
                msnew[nnew++] = ms[i];
                break;
            }

            /*
             * Normal case: consume two elements from the input list
             * and combine them.
             */
            uint32_t m1 = ms[i], m2 = ms[i+1], m = m1*m2;
            sched_append(sched, ENC_COMBINE_BASE + m1);

            /*
             * And then, as long as the combined limit is big enough,
             * emit an output byte from the bottom of it.
             */
            while (m >= (1<<14)) {
                sched_append(sched, ENC_BYTE);
                m = (m + 0xFF) >> 8;
            }

            /*
             * Whatever is left after that, we emit into the output
             * list and append to the fifo.
             */
            msnew[nnew++] = m;
        }

        /*
         * End of pass. The output list of (m_i) now becomes the input
         * list.
         */
        uint32_t *tmp = ms;
        ms = msnew;
        n = nnew;
        msnew = tmp;
    }

    /*
     * When that loop terminates, it's because there's exactly one
     * number left to encode. (Or, technically, _at most_ one - but we
     * don't support encoding a completely empty list in this
     * implementation, because what would be the point?) That number
     * is just emitted little-endian until its limit is 1 (meaning its
     * only possible actual value is 0).
     */
    assert(n == 1);
    uint32_t m = ms[0];
    while (m > 1) {
        sched_append(sched, ENC_BYTE);
        m = (m + 0xFF) >> 8;
    }

    sfree(ms);
    sfree(msnew);

    return sched;
}